

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

int glfwGetKey(GLFWwindow *handle,int key)

{
  char *format;
  int error;
  
  if (_glfwInitialized == '\0') {
    error = 0x10001;
    format = (char *)0x0;
  }
  else {
    if ((uint)key < 0x15d) {
      if ((char)handle[(ulong)(uint)key + 100] != 3) {
        return (int)(char)handle[(ulong)(uint)key + 100];
      }
      handle[(ulong)(uint)key + 100] = (GLFWwindow)0x0;
      return 1;
    }
    format = "Invalid key";
    error = 0x10003;
  }
  _glfwInputError(error,format);
  return 0;
}

Assistant:

GLFWAPI int glfwGetKey(GLFWwindow* handle, int key)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_RELEASE);

    if (key < 0 || key > GLFW_KEY_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid key");
        return GLFW_RELEASE;
    }

    if (window->keys[key] == _GLFW_STICK)
    {
        // Sticky mode: release key now
        window->keys[key] = GLFW_RELEASE;
        return GLFW_PRESS;
    }

    return (int) window->keys[key];
}